

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

int wabt::OptionParser::Match(char *s,string *full,bool has_argument)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar3 = 0; cVar1 = (full->_M_dataplus)._M_p[uVar3], cVar1 != '\0'; uVar3 = uVar3 + 1) {
    if (s[uVar3] == '\0') goto LAB_00141b5a;
    if (s[uVar3] != cVar1) {
      return -1;
    }
  }
  if (s[uVar3] == '\0') {
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  else {
    uVar2 = uVar3;
    if (!has_argument) {
      uVar2 = 0xffffffffffffffff;
    }
    if (s[uVar3] != '=') {
      uVar2 = 0xffffffffffffffff;
    }
    uVar3 = uVar2 & 0xffffffff;
  }
LAB_00141b5a:
  return (int)uVar3;
}

Assistant:

int OptionParser::Match(const char* s,
                        const std::string& full,
                        bool has_argument) {
  int i;
  for (i = 0;; i++) {
    if (full[i] == '\0') {
      // Perfect match. Return +1, so it will be preferred over a longer option
      // with the same prefix.
      if (s[i] == '\0') {
        return i + 1;
      }

      // We want to fail if s is longer than full, e.g. --foobar vs. --foo.
      // However, if s ends with an '=', it's OK.
      if (!(has_argument && s[i] == '=')) {
        return -1;
      }
      break;
    }
    if (s[i] == '\0') {
      break;
    }
    if (s[i] != full[i]) {
      return -1;
    }
  }
  return i;
}